

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O2

void aalcalcmeanonly::WriteCsvOutputFile(bool skipHeader,bool ordOutput)

{
  _Rb_tree_node_base *p_Var1;
  undefined7 in_register_00000039;
  char *__s;
  long lVar2;
  
  if ((int)CONCAT71(in_register_00000039,skipHeader) == 0) {
    __s = "summary_id,type,mean";
    if (ordOutput) {
      __s = "SummaryId,SampleType,MeanLoss";
    }
    puts(__s);
  }
  for (p_Var1 = (_Rb_tree_node_base *)means_._24_8_; lVar2 = 0x28,
      p_Var1 != (_Rb_tree_node_base *)(means_ + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    for (; lVar2 != 0x38; lVar2 = lVar2 + 8) {
      printf("%d,%ld,%f\n",*(double *)((long)&p_Var1->_M_color + lVar2) / (double)nPeriods_,
             (ulong)p_Var1[1]._M_color,(lVar2 + -0x28 >> 3) + 1);
    }
  }
  return;
}

Assistant:

inline void WriteCsvOutputFile(const bool skipHeader, const bool ordOutput) {

    if (!skipHeader) {
      if (ordOutput) {
        printf("SummaryId,SampleType,MeanLoss\n");
      } else {
        printf("summary_id,type,mean\n");
      }
    }

    for (auto sumIter = means_.begin(); sumIter != means_.end(); ++sumIter) {
      for (auto typeIter = sumIter->second.begin();
	   typeIter != sumIter->second.end(); ++typeIter) {

        printf("%d,%ld,%f\n",
	       sumIter->first,
	       typeIter - sumIter->second.begin() + 1,
	       (*typeIter) / nPeriods_);

      }
    }

  }